

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::setFederateTag
          (CommonCore *this,LocalFederateId fid,string_view tag,string_view value)

{
  int iVar1;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  pointer_____offset_0x10___ *ppuVar2;
  string_view message;
  string_view message_00;
  ActionMessage tagcmd;
  ActionMessage AStack_e8;
  
  if (setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
      ::trueString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                                 ::trueString_abi_cxx11_);
    if (iVar1 != 0) {
      setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
      ::trueString_abi_cxx11_._M_dataplus._M_p =
           (pointer)&setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                     ::trueString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                  ::trueString_abi_cxx11_,"true","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                    ::trueString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                           ::trueString_abi_cxx11_);
    }
  }
  if (tag._M_len == 0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "tag cannot be an empty string for setFederateTag";
    message._M_len = 0x30;
    InvalidParameter::InvalidParameter((InvalidParameter *)this_01,message);
    ppuVar2 = &InvalidParameter::typeinfo;
  }
  else {
    if (fid.fid == -0x103) {
      ActionMessage::ActionMessage(&AStack_e8,cmd_core_tag);
      AStack_e8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
      AStack_e8.dest_id.gid = AStack_e8.source_id.gid;
      ActionMessage::setStringData(&AStack_e8,tag,value);
      BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
      ActionMessage::~ActionMessage(&AStack_e8);
      return;
    }
    this_00 = getFederateAt(this,fid);
    if (this_00 != (FederateState *)0x0) {
      FederateState::setTag(this_00,tag,value);
      return;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message_00._M_str = "federateID not valid (setFederateTag)";
    message_00._M_len = 0x25;
    InvalidIdentifier::InvalidIdentifier(this_01,message_00);
    ppuVar2 = &InvalidIdentifier::typeinfo;
  }
  __cxa_throw(this_01,ppuVar2,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setFederateTag(LocalFederateId fid, std::string_view tag, std::string_view value)
{
    static const std::string trueString{"true"};
    if (tag.empty()) {
        throw InvalidParameter("tag cannot be an empty string for setFederateTag");
    }

    if (fid == gLocalCoreId) {
        ActionMessage tagcmd(CMD_CORE_TAG);
        tagcmd.source_id = getGlobalId();
        tagcmd.dest_id = tagcmd.source_id;
        tagcmd.setStringData(tag, value);
        addActionMessage(std::move(tagcmd));
        return;
    }

    auto* fed = getFederateAt(fid);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setFederateTag)"));
    }
    fed->setTag(tag, value);
}